

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *
pbrt::BilinearPatch::CreatePatches(BilinearPatchMesh *mesh,Allocator alloc)

{
  unsigned_long *args_3;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *this;
  int *in_RDX;
  char (*in_RSI) [8];
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *in_RDI;
  int i;
  BilinearPatch *patches;
  int meshIndex;
  int vb;
  size_t va;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *blps;
  BilinearPatch *in_stack_ffffffffffffff48;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffff50;
  BilinearPatch *in_stack_ffffffffffffff58;
  vector<const_pbrt::BilinearPatchMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::BilinearPatchMesh_*>_>
  *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *args_1;
  char (*in_stack_ffffffffffffffa0) [18];
  undefined4 in_stack_ffffffffffffffa8;
  int iVar1;
  undefined4 in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  LogLevel in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  
  args_1 = in_RDI;
  args_3 = (unsigned_long *)
           pstd::
           vector<const_pbrt::BilinearPatchMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::BilinearPatchMesh_*>_>
           ::size(allMeshes);
  if (args_3 < (unsigned_long *)0xffffffff80000000) {
    pstd::
    vector<const_pbrt::BilinearPatchMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::BilinearPatchMesh_*>_>
    ::size(allMeshes);
    pstd::
    vector<const_pbrt::BilinearPatchMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::BilinearPatchMesh_*>_>
    ::push_back(in_stack_ffffffffffffff60,(BilinearPatchMesh **)in_stack_ffffffffffffff58);
    this = (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *)
           (long)*(int *)(*in_RSI + 4);
    pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>::polymorphic_allocator<std::byte>
              ((polymorphic_allocator<pbrt::ShapeHandle> *)in_stack_ffffffffffffff50,
               (polymorphic_allocator<std::byte> *)in_stack_ffffffffffffff48);
    pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::vector
              (this,in_stack_ffffffffffffff68,
               (polymorphic_allocator<pbrt::ShapeHandle> *)in_stack_ffffffffffffff60);
    pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::BilinearPatch>
              (in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
    for (iVar1 = 0; iVar1 < *(int *)(*in_RSI + 4); iVar1 = iVar1 + 1) {
      pstd::pmr::polymorphic_allocator<std::byte>::construct<pbrt::BilinearPatch,int&,int&>
                ((polymorphic_allocator<std::byte> *)in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff58,(int *)in_stack_ffffffffffffff50,
                 &in_stack_ffffffffffffff48->meshIndex);
      ShapeHandle::TaggedPointer<pbrt::BilinearPatch>
                ((ShapeHandle *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
      operator[](in_RDI,(long)iVar1);
      ShapeHandle::operator=
                ((ShapeHandle *)in_stack_ffffffffffffff50,(ShapeHandle *)in_stack_ffffffffffffff48);
    }
    return args_1;
  }
  LogFatal<char_const(&)[18],char_const(&)[8],char_const(&)[18],unsigned_long&,char_const(&)[8],int&>
            (in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
             (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             in_stack_ffffffffffffffa0,(char (*) [8])args_1,
             (char (*) [18])CONCAT44(0x80000000,in_stack_ffffffffffffffd0),args_3,in_RSI,in_RDX);
}

Assistant:

pstd::vector<ShapeHandle> BilinearPatch::CreatePatches(const BilinearPatchMesh *mesh,
                                                       Allocator alloc) {
    CHECK_LT(allMeshes->size(), 1 << 31);
    int meshIndex = int(allMeshes->size());

    allMeshes->push_back(mesh);

    pstd::vector<ShapeHandle> blps(mesh->nPatches, alloc);
    BilinearPatch *patches = alloc.allocate_object<BilinearPatch>(mesh->nPatches);
    for (int i = 0; i < mesh->nPatches; ++i) {
        alloc.construct(&patches[i], meshIndex, i);
        blps[i] = &patches[i];
    }

    return blps;
}